

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isojoliet_long.c
# Opt level: O0

void test_read_format_isojoliet_long(void)

{
  archive *paVar1;
  int i;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char pathname [104];
  char *refname;
  char *in_stack_00000340;
  archive *in_stack_ffffffffffffff28;
  archive *paVar2;
  char *pcVar3;
  archive_entry **entry;
  archive_entry *paVar4;
  archive_entry_conflict *entry_00;
  int64_t *piVar5;
  void *extra;
  archive *in_stack_ffffffffffffff30;
  uint uVar7;
  size_t *s;
  archive *paVar6;
  char *e2;
  archive *in_stack_ffffffffffffff38;
  archive *_a;
  undefined4 in_stack_ffffffffffffff40;
  wchar_t in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  wchar_t wVar8;
  undefined4 in_stack_ffffffffffffff58;
  int iVar9;
  void *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff70;
  archive_entry *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  wchar_t in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  
  wVar8 = (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  for (iVar9 = 0; iVar9 < 100; iVar9 = iVar9 + 1) {
    (&stack0xffffffffffffff88)[iVar9] = (char)((iVar9 + 1) % 10) + '0';
  }
  extract_reference_file(in_stack_00000340);
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (wchar_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28);
  archive_read_support_filter_all(in_stack_ffffffffffffff28);
  paVar2 = (archive *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,0,
                      (char *)0x17ed07,in_stack_ffffffffffffff60);
  archive_read_support_format_all(paVar2);
  pcVar3 = (char *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,0,
                      (char *)0x17ed3f,in_stack_ffffffffffffff60);
  archive_read_set_options(in_stack_ffffffffffffff30,pcVar3);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,0,
                      (char *)0x17ed7e,in_stack_ffffffffffffff60);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
  entry = (archive_entry **)0x0;
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,0,
                      (char *)0x17edc3,in_stack_ffffffffffffff60);
  archive_read_next_header(in_stack_ffffffffffffff30,entry);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,0,
                      (char *)0x17ee00,in_stack_ffffffffffffff60);
  uVar7 = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  archive_entry_pathname(paVar4);
  paVar6 = (archive *)((ulong)uVar7 << 0x20);
  assertion_equal_string
            ((char *)CONCAT44(iVar9,in_stack_ffffffffffffff58),wVar8,in_stack_ffffffffffffff48,
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38,(char *)paVar6,in_stack_ffffffffffffff70,
             (wchar_t)paVar1);
  archive_entry_filetype(in_stack_ffffffffffffff80);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17ee84,
                      in_stack_ffffffffffffff60);
  archive_entry_size(in_stack_ffffffffffffff80);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17eebf,
                      in_stack_ffffffffffffff60);
  archive_entry_mtime(in_stack_ffffffffffffff80);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17eefa,
                      in_stack_ffffffffffffff60);
  archive_entry_mtime_nsec(in_stack_ffffffffffffff80);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17ef32,
                      in_stack_ffffffffffffff60);
  archive_entry_ctime(in_stack_ffffffffffffff80);
  entry_00 = (archive_entry_conflict *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17ef6d,
                      in_stack_ffffffffffffff60);
  archive_entry_stat(entry_00);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17efa9,
                      in_stack_ffffffffffffff60);
  archive_entry_uid(in_stack_ffffffffffffff80);
  piVar5 = (int64_t *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17efe1,
                      in_stack_ffffffffffffff60);
  archive_read_data_block
            ((archive *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (void **)in_stack_ffffffffffffff38,(size_t *)paVar6,piVar5);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,(longlong)paVar1,
                      (char *)0x17f02a,in_stack_ffffffffffffff60);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17f05e,
                      in_stack_ffffffffffffff60);
  archive_entry_is_encrypted(in_stack_ffffffffffffff80);
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17f097,
                      in_stack_ffffffffffffff60);
  archive_read_has_encrypted_entries(in_stack_ffffffffffffff38);
  paVar2 = paVar1;
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,(longlong)paVar1,
                      (char *)0x17f0d3,in_stack_ffffffffffffff60);
  archive_read_next_header(paVar6,(archive_entry **)paVar1);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (longlong)in_stack_ffffffffffffff38,(char *)paVar6,0,(char *)0x17f130,
                      in_stack_ffffffffffffff60);
  pcVar3 = &stack0xffffffffffffff88;
  archive_entry_pathname(paVar4);
  paVar6 = (archive *)((ulong)paVar6 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)CONCAT44(iVar9,in_stack_ffffffffffffff58),wVar8,pcVar3,
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38,(char *)paVar6,in_stack_ffffffffffffff70,
             (wchar_t)paVar2);
  archive_entry_filetype(in_stack_ffffffffffffff80);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,
                      (char *)paVar6,0,(char *)0x17f1bc,in_stack_ffffffffffffff60);
  archive_entry_size(in_stack_ffffffffffffff80);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,
                      (char *)paVar6,0,(char *)0x17f1f7,in_stack_ffffffffffffff60);
  archive_entry_mtime(in_stack_ffffffffffffff80);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,
                      (char *)paVar6,0,(char *)0x17f232,in_stack_ffffffffffffff60);
  archive_entry_atime(in_stack_ffffffffffffff80);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,
                      (char *)paVar6,0,(char *)0x17f26d,in_stack_ffffffffffffff60);
  archive_entry_is_encrypted(in_stack_ffffffffffffff80);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,
                      (char *)paVar6,0,(char *)0x17f2a6,in_stack_ffffffffffffff60);
  archive_read_has_encrypted_entries(in_stack_ffffffffffffff38);
  paVar1 = paVar2;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,
                      (char *)paVar6,(longlong)paVar2,(char *)0x17f2e2,in_stack_ffffffffffffff60);
  archive_read_next_header(paVar6,(archive_entry **)paVar2);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,
                      (char *)paVar6,0,(char *)0x17f33f,in_stack_ffffffffffffff60);
  archive_entry_pathname(paVar4);
  s = (size_t *)((ulong)paVar6 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)CONCAT44(iVar9,in_stack_ffffffffffffff58),wVar8,pcVar3,
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38,(char *)s,in_stack_ffffffffffffff70,(wchar_t)paVar1);
  archive_entry_filetype(in_stack_ffffffffffffff80);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,(char *)s
                      ,0,(char *)0x17f3c3,in_stack_ffffffffffffff60);
  archive_entry_hardlink(paVar4);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (wchar_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff38,(char *)s,paVar4);
  archive_entry_size(in_stack_ffffffffffffff80);
  piVar5 = (int64_t *)0x0;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,(char *)s
                      ,0,(char *)0x17f431,in_stack_ffffffffffffff60);
  archive_read_data_block
            ((archive *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (void **)in_stack_ffffffffffffff38,s,piVar5);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,(char *)s
                      ,0,(char *)0x17f478,in_stack_ffffffffffffff60);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,(char *)s
                      ,0,(char *)0x17f4ae,in_stack_ffffffffffffff60);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)in_stack_ffffffffffffff38,(char *)s
                      ,0,(char *)0x17f4de,in_stack_ffffffffffffff60);
  paVar6 = (archive *)0x2e6187;
  _a = (archive *)0x0;
  assertion_equal_mem(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
                      (char *)in_stack_ffffffffffffff80,paVar1,in_stack_ffffffffffffff70,
                      in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0)
  ;
  archive_entry_is_encrypted(in_stack_ffffffffffffff80);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,0,
                      (char *)0x17f562,in_stack_ffffffffffffff60);
  archive_read_has_encrypted_entries(_a);
  paVar2 = paVar1;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,(longlong)paVar1,
                      (char *)0x17f59e,in_stack_ffffffffffffff60);
  archive_read_next_header(paVar6,(archive_entry **)paVar1);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,0,
                      (char *)0x17f5db,in_stack_ffffffffffffff60);
  wVar8 = (wchar_t)((ulong)&stack0xffffffffffffff88 >> 0x20);
  archive_entry_pathname(paVar4);
  e2 = (char *)((ulong)paVar6 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)CONCAT44(iVar9,in_stack_ffffffffffffff58),wVar8,pcVar3,
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(char *)_a,e2,
             in_stack_ffffffffffffff70,(wchar_t)paVar2);
  archive_entry_filetype(in_stack_ffffffffffffff80);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,e2,0,(char *)0x17f667,
                      in_stack_ffffffffffffff60);
  archive_entry_hardlink(paVar4);
  extra = (void *)0x0;
  paVar6 = (archive *)((ulong)e2 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)CONCAT44(iVar9,in_stack_ffffffffffffff58),wVar8,pcVar3,
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(char *)_a,
             (char *)paVar6,in_stack_ffffffffffffff70,(wchar_t)paVar2);
  archive_entry_size_is_set(in_stack_ffffffffffffff80);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,(char *)paVar6,extra);
  archive_entry_is_encrypted(in_stack_ffffffffffffff80);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,0,
                      (char *)0x17f71b,in_stack_ffffffffffffff60);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,(longlong)paVar2,
                      (char *)0x17f757,in_stack_ffffffffffffff60);
  archive_read_next_header(paVar6,(archive_entry **)paVar2);
  iVar9 = 0;
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,0,
                      (char *)0x17f797,in_stack_ffffffffffffff60);
  archive_filter_code(paVar6,iVar9);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,0,
                      (char *)0x17f7d5,in_stack_ffffffffffffff60);
  archive_read_close((archive *)0x17f7df);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,(longlong)paVar1,
                      (char *)0x17f80e,in_stack_ffffffffffffff60);
  archive_read_free((archive *)0x17f818);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff44,(longlong)_a,(char *)paVar6,0,
                      (char *)0x17f846,in_stack_ffffffffffffff60);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isojoliet_long)
{
	const char *refname = "test_read_format_iso_joliet_long.iso.Z";
	char pathname[104];
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	for (i = 0; i < 100; i++)
		pathname[i] = '0' + ((i+1) % 10); 
	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_set_options(a, "iso9660:!rockridge"));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* First entry is '.' root directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(86401, archive_entry_ctime(ae));
	assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(0, archive_entry_uid(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A directory. */
	pathname[100] = 'd';
	pathname[101] = 'i';
	pathname[102] = 'r';
	pathname[103] = '\0';
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(pathname, archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A regular file with two names (pathname gets returned
	 * first, so it's not marked as a hardlink). */
	pathname[100] = '1';
	pathname[101] = '2';
	pathname[102] = '3';
	pathname[103] = '\0';
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("hardlink", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assert(archive_entry_hardlink(ae) == NULL);
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(0, archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt(6, (int)size);
	assertEqualInt(0, offset);
	assertEqualMem(p, "hello\n", 6);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Second name for the same regular file (this happens to be
	 * returned second, so does get marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(pathname, archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("hardlink", archive_entry_hardlink(ae));
	assert(!archive_entry_size_is_set(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}